

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
                  *this,array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                        *container,MatchResultListener *listener)

{
  undefined1 *this_00;
  bool bVar1;
  Flags FVar2;
  const_reference this_01;
  const_iterator elem_first;
  const_iterator elem_last;
  size_t sVar3;
  size_t sVar4;
  MatchResultListener *this_02;
  bool local_e2;
  undefined1 local_88 [32];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *container_local;
  UnorderedElementsAreMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  *this_local;
  
  this_01 = StlContainerView<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_>
            ::ConstReference(container);
  this_00 = &matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  elem_first = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
               ::begin(this_01);
  elem_last = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              ::end(this_01);
  UnorderedElementsAreMatcherImpl<std::array<std::__cxx11::string,2ul>const&>::
  AnalyzeElements<std::__cxx11::string_const*>
            ((MatchMatrix *)(local_88 + 0x18),
             (UnorderedElementsAreMatcherImpl<std::array<std::__cxx11::string,2ul>const&> *)this,
             elem_first,elem_last,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,listener);
  sVar3 = MatchMatrix::LhsSize((MatchMatrix *)(local_88 + 0x18));
  if ((sVar3 == 0) && (sVar3 = MatchMatrix::RhsSize((MatchMatrix *)(local_88 + 0x18)), sVar3 == 0))
  {
    this_local._7_1_ = true;
  }
  else {
    FVar2 = UnorderedElementsAreMatcherImplBase::match_flags
                      (&this->super_UnorderedElementsAreMatcherImplBase);
    if (FVar2 == ExactMatch) {
      sVar3 = MatchMatrix::LhsSize((MatchMatrix *)(local_88 + 0x18));
      sVar4 = MatchMatrix::RhsSize((MatchMatrix *)(local_88 + 0x18));
      if (sVar3 != sVar4) {
        sVar3 = MatchMatrix::LhsSize((MatchMatrix *)(local_88 + 0x18));
        if ((sVar3 != 0) && (bVar1 = MatchResultListener::IsInterested(listener), bVar1)) {
          this_02 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
          sVar3 = MatchMatrix::LhsSize((MatchMatrix *)(local_88 + 0x18));
          UnorderedElementsAreMatcherImplBase::Elements
                    ((UnorderedElementsAreMatcherImplBase *)local_88,sVar3);
          MatchResultListener::operator<<(this_02,(Message *)local_88);
          Message::~Message((Message *)local_88);
        }
        this_local._7_1_ = false;
        goto LAB_0013427f;
      }
    }
    bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                      (&this->super_UnorderedElementsAreMatcherImplBase,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10,(MatchMatrix *)(local_88 + 0x18),listener);
    local_e2 = false;
    if (bVar1) {
      local_e2 = UnorderedElementsAreMatcherImplBase::FindPairing
                           (&this->super_UnorderedElementsAreMatcherImplBase,
                            (MatchMatrix *)(local_88 + 0x18),listener);
    }
    this_local._7_1_ = local_e2;
  }
LAB_0013427f:
  local_88._8_4_ = 1;
  MatchMatrix::~MatchMatrix((MatchMatrix *)(local_88 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
      return true;
    }

    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      if (matrix.LhsSize() != matrix.RhsSize()) {
        // The element count doesn't match.  If the container is empty,
        // there's no need to explain anything as Google Mock already
        // prints the empty container. Otherwise we just need to show
        // how many elements there actually are.
        if (matrix.LhsSize() != 0 && listener->IsInterested()) {
          *listener << "which has " << Elements(matrix.LhsSize());
        }
        return false;
      }
    }

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }